

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selector_table.cc
# Opt level: O0

uint sel_copyTypedSelectors_np(char *selName,SEL *sels,uint count)

{
  bool bVar1;
  SEL poVar2;
  forward_list<const_char_*,_std::allocator<const_char_*>_> *this;
  reference ppcVar3;
  char *type_1;
  iterator __end1;
  _Self __begin1;
  TypeList *__range1;
  uint found;
  char *type;
  iterator __end2;
  _Self __begin2;
  TypeList *__range2;
  TypeList *l;
  SEL untyped;
  uint count_local;
  SEL *sels_local;
  char *selName_local;
  
  if (selName == (char *)0x0) {
    selName_local._4_4_ = 0;
  }
  else {
    poVar2 = selector_lookup(selName,(char *)0x0);
    if (poVar2 == (SEL)0x0) {
      selName_local._4_4_ = 0;
    }
    else {
      this = &anon_unknown.dwarf_181b3::selLookup((uint32_t)(poVar2->field_0).index)->
              super_forward_list<const_char_*,_std::allocator<const_char_*>_>;
      if (this == (forward_list<const_char_*,_std::allocator<const_char_*>_> *)0x0) {
        selName_local._4_4_ = 0;
      }
      else if (count == 0) {
        __end2._M_node =
             (_Fwd_list_node_base *)anon_unknown.dwarf_181b3::TypeList::begin((TypeList *)this);
        type = (char *)std::forward_list<const_char_*,_std::allocator<const_char_*>_>::end(this);
        untyped._4_4_ = 0;
        while (bVar1 = std::operator!=(&__end2,(_Self *)&type), bVar1) {
          std::_Fwd_list_iterator<const_char_*>::operator*(&__end2);
          untyped._4_4_ = untyped._4_4_ + 1;
          std::_Fwd_list_iterator<const_char_*>::operator++(&__end2);
        }
        selName_local._4_4_ = untyped._4_4_;
      }
      else {
        __range1._4_4_ = 0;
        __end1._M_node =
             (_Fwd_list_node_base *)anon_unknown.dwarf_181b3::TypeList::begin((TypeList *)this);
        type_1 = (char *)std::forward_list<const_char_*,_std::allocator<const_char_*>_>::end(this);
        while (bVar1 = std::operator!=(&__end1,(_Self *)&type_1), bVar1) {
          ppcVar3 = std::_Fwd_list_iterator<const_char_*>::operator*(&__end1);
          if (count < __range1._4_4_) break;
          poVar2 = selector_lookup(selName,*ppcVar3);
          sels[__range1._4_4_] = poVar2;
          std::_Fwd_list_iterator<const_char_*>::operator++(&__end1);
          __range1._4_4_ = __range1._4_4_ + 1;
        }
        selName_local._4_4_ = __range1._4_4_;
      }
    }
  }
  return selName_local._4_4_;
}

Assistant:

unsigned sel_copyTypedSelectors_np(const char *selName, SEL *const sels, unsigned count)
{
	if (nullptr == selName) { return 0; }
	SEL untyped = selector_lookup(selName, 0);
	if (untyped == nullptr) { return 0; }

	auto *l = selLookup(untyped->index);
	if (l == nullptr)
	{
		return 0;
	}

	if (count == 0)
	{
		for (auto type : *l)
		{
			count++;
		}
		return count;
	}

	unsigned found = 0;
	for (auto type : *l)
	{
		if (found > count)
		{
			break;
		}
		sels[found++] = selector_lookup(selName, type);
	}
	return found;
}